

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void append_set(t_append *x,t_symbol *templatesym,t_symbol *field)

{
  t_symbol *ptVar1;
  t_symbol *field_local;
  t_symbol *templatesym_local;
  t_append *x_local;
  
  if (x->x_nin == 1) {
    ptVar1 = template_getbindsym(templatesym);
    x->x_templatesym = ptVar1;
    x->x_variables->gv_sym = field;
    x->x_variables->gv_f = 0.0;
  }
  else {
    pd_error(x,"append set: cannot set multiple fields.");
  }
  return;
}

Assistant:

static void append_set(t_append *x, t_symbol *templatesym, t_symbol *field)
{
    if (x->x_nin != 1)
        pd_error(x, "append set: cannot set multiple fields.");
    else
    {
       x->x_templatesym = template_getbindsym(templatesym);
       x->x_variables->gv_sym = field;
       x->x_variables->gv_f = 0;
    }
}